

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

bool __thiscall QSQLiteResult::execBatch(QSQLiteResult *this,bool arrayBind)

{
  QList<QVariant> *this_00;
  byte bVar1;
  long lVar2;
  QHash<QString,_QList<int>_> QVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QVariant *pQVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  Data *pDVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  ulong local_c0;
  QHash<QString,_QList<int>_> local_98;
  QArrayDataPointer<QVariant> local_90;
  QList<QVariant> *local_78;
  QArrayDataPointer<QVariant> local_70;
  QArrayDataPointer<QVariant> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  this_00 = (QList<QVariant> *)(lVar2 + 0x60);
  local_70.d = *(Data **)(lVar2 + 0x60);
  local_70.ptr = *(QVariant **)(lVar2 + 0x68);
  local_70.size = *(qsizetype *)(lVar2 + 0x70);
  if (local_70.d == (Data *)0x0) {
    local_58.d = (Data *)0x0;
    local_58.size = local_70.size;
    local_58.ptr = local_70.ptr;
  }
  else {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_58.d = *(Data **)(lVar2 + 0x60);
    local_58.size = *(long *)(lVar2 + 0x70);
    local_58.ptr = *(QVariant **)(lVar2 + 0x68);
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = this_00;
  if (local_58.size == 0) {
    cVar8 = '\0';
  }
  else {
    QVariant::toList();
    qVar4 = local_90.size;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
    if (qVar4 == 0) {
      cVar8 = '\x01';
    }
    else {
      puVar11 = (undefined8 *)(lVar2 + 0x78);
      local_c0 = 0;
      do {
        QList<QVariant>::clear(this_00);
        local_98.d = (Data *)*puVar11;
        if (local_98.d == (Data *)0x0) {
LAB_0011343a:
          pDVar10 = (Data *)0x0;
          uVar12 = 0;
LAB_00113440:
          if (uVar12 == 0) goto joined_r0x00113448;
        }
        else {
          pDVar10 = local_98.d;
          if (*(int *)local_98.d != -1) {
            LOCK();
            *(int *)local_98.d = *(int *)local_98.d + 1;
            UNLOCK();
            pDVar10 = (Data *)*puVar11;
            if (pDVar10 == (Data *)0x0) goto LAB_0011343a;
          }
          if (**(char **)(pDVar10 + 0x20) == -1) {
            uVar7 = 1;
            do {
              uVar12 = uVar7;
              if (*(ulong *)(pDVar10 + 0x10) == uVar12) goto LAB_0011343a;
              uVar7 = uVar12 + 1;
            } while ((*(char **)(pDVar10 + 0x20))
                     [(ulong)((uint)uVar12 & 0x7f) + (uVar12 >> 7) * 0x90] == -1);
            goto LAB_00113440;
          }
          uVar12 = 0;
        }
        do {
          do {
            lVar9 = (uVar12 >> 7) * 0x90;
            lVar2 = *(long *)(*(long *)(pDVar10 + 0x20) + 0x80 + lVar9);
            bVar1 = *(byte *)((ulong)((uint)uVar12 & 0x7f) + *(long *)(pDVar10 + 0x20) + lVar9);
            QVariant::toList();
            (**(code **)(*(long *)this + 0x68))
                      (this,lVar2 + (ulong)((uint)bVar1 * 0x30),local_90.ptr + local_c0,1);
            QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
            do {
              if (*(long *)(pDVar10 + 0x10) - 1U == uVar12) {
                uVar12 = 0;
                pDVar10 = (Data *)0x0;
                break;
              }
              uVar12 = uVar12 + 1;
            } while (*(char *)((ulong)((uint)uVar12 & 0x7f) +
                              (uVar12 >> 7) * 0x90 + *(long *)(pDVar10 + 0x20)) == -1);
          } while (uVar12 != 0);
joined_r0x00113448:
        } while (pDVar10 != (Data *)0x0);
        cVar8 = (**(code **)(*(long *)this + 0x48))();
        QVar3.d = local_98.d;
        local_98.d = (Data *)0x0;
        local_90.d = (Data *)*puVar11;
        *puVar11 = QVar3.d;
        QHash<QString,_QList<int>_>::~QHash((QHash<QString,_QList<int>_> *)&local_90);
        QHash<QString,_QList<int>_>::~QHash(&local_98);
        if (cVar8 == '\0') break;
        local_c0 = local_c0 + 1;
        QVariant::toList();
        qVar4 = local_90.size;
        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
      } while (local_c0 < (ulong)qVar4);
    }
  }
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_58);
  qVar4 = local_70.size;
  pQVar6 = local_70.ptr;
  pDVar5 = local_70.d;
  local_70.size = 0;
  local_70.d = (Data *)0x0;
  local_70.ptr = (QVariant *)0x0;
  local_58.d = (local_78->d).d;
  local_58.ptr = (local_78->d).ptr;
  (local_78->d).d = pDVar5;
  (local_78->d).ptr = pQVar6;
  local_58.size = (local_78->d).size;
  (local_78->d).size = qVar4;
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::execBatch(bool arrayBind)
{
    Q_UNUSED(arrayBind);
    Q_D(QSqlResult);
    QScopedValueRollback<QList<QVariant>> valuesScope(d->values);
    QList<QVariant> values = d->values;
    if (values.size() == 0)
        return false;

    for (int i = 0; i < values.at(0).toList().size(); ++i) {
        d->values.clear();
        QScopedValueRollback<QHash<QString, QList<int>>> indexesScope(d->indexes);
        auto it = d->indexes.constBegin();
        while (it != d->indexes.constEnd()) {
            bindValue(it.key(), values.at(it.value().first()).toList().at(i), QSql::In);
            ++it;
        }
        if (!exec())
            return false;
    }
    return true;
}